

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_example.cc
# Opt level: O0

void DumpTextureInfo(TextureInfo *texinfo,int indent)

{
  ostream *poVar1;
  ulong uVar2;
  string local_f0 [32];
  string local_d0 [39];
  allocator local_a9;
  undefined1 local_a8 [64];
  string local_68 [48];
  string local_38 [36];
  int local_14;
  TextureInfo *pTStack_10;
  int indent_local;
  TextureInfo *texinfo_local;
  
  local_14 = indent;
  pTStack_10 = texinfo;
  Indent_abi_cxx11_((int)local_38);
  poVar1 = std::operator<<((ostream *)&std::cout,local_38);
  poVar1 = std::operator<<(poVar1,"index     : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pTStack_10->index);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_38);
  Indent_abi_cxx11_((int)local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,local_68);
  poVar1 = std::operator<<(poVar1,"texCoord  : TEXCOORD_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pTStack_10->texCoord);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_68);
  DumpExtensions(&pTStack_10->extensions,local_14 + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a8,"extras",&local_a9);
  PrintValue((string *)(local_a8 + 0x20),(Value *)local_a8,(int)pTStack_10 + 8,
             (bool)((char)local_14 + '\x01'));
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)(local_a8 + 0x20));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)(local_a8 + 0x20));
  std::__cxx11::string::~string((string *)local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Indent_abi_cxx11_((int)local_d0);
    poVar1 = std::operator<<((ostream *)&std::cout,local_d0);
    poVar1 = std::operator<<(poVar1,"extensions(JSON string) = ");
    poVar1 = std::operator<<(poVar1,(string *)&pTStack_10->extensions_json_string);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_d0);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Indent_abi_cxx11_((int)local_f0);
    poVar1 = std::operator<<((ostream *)&std::cout,local_f0);
    poVar1 = std::operator<<(poVar1,"extras(JSON string) = ");
    poVar1 = std::operator<<(poVar1,(string *)&pTStack_10->extras_json_string);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_f0);
  }
  return;
}

Assistant:

static void DumpTextureInfo(const tinygltf::TextureInfo &texinfo,
                            const int indent) {
  std::cout << Indent(indent) << "index     : " << texinfo.index << "\n";
  std::cout << Indent(indent) << "texCoord  : TEXCOORD_" << texinfo.texCoord
            << "\n";
  DumpExtensions(texinfo.extensions, indent + 1);
  std::cout << PrintValue("extras", texinfo.extras, indent + 1) << "\n";

  if (!texinfo.extensions_json_string.empty()) {
    std::cout << Indent(indent)
              << "extensions(JSON string) = " << texinfo.extensions_json_string
              << "\n";
  }

  if (!texinfo.extras_json_string.empty()) {
    std::cout << Indent(indent)
              << "extras(JSON string) = " << texinfo.extras_json_string << "\n";
  }
}